

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

void arena_i_decay(tsdn_t *tsdn,uint arena_ind,_Bool all)

{
  uint uVar1;
  arena_t *paVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  void *pvVar6;
  ulong uVar7;
  undefined1 ***apppuStack_40 [2];
  
  apppuStack_40[0] = (undefined1 ***)0x1c3a7f6;
  iVar4 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  if (iVar4 != 0) {
    apppuStack_40[0] = (undefined1 ***)0x1c3a806;
    duckdb_je_malloc_mutex_lock_slow(&ctl_mtx);
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (ctl_mtx.field_0.field_0.prof_data.prev_owner != tsdn) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = tsdn;
  }
  uVar1 = ctl_arenas->narenas;
  if (uVar1 == arena_ind || arena_ind == 0x1000) {
    uVar7 = (ulong)uVar1;
    lVar3 = -(uVar7 * 8 + 0xf & 0xfffffffffffffff0);
    if (uVar7 == 0) {
      ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
      apppuStack_40[1] = (undefined1 ***)(apppuStack_40 + 1);
      *(undefined8 *)((long)apppuStack_40 + lVar3) = 0x1c3a932;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
    }
    else {
      uVar5 = 0;
      apppuStack_40[1] = (undefined1 ***)(apppuStack_40 + 1);
      do {
        pvVar6 = duckdb_je_arenas[uVar5].repr;
        if (pvVar6 == (void *)0x0) {
          pvVar6 = (void *)0x0;
        }
        *(void **)((long)apppuStack_40 + uVar5 * 8 + lVar3 + -0x38 + 0x40) = pvVar6;
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
      ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
      *(undefined8 *)((long)apppuStack_40 + lVar3) = 0x1c3a8f2;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
      if (uVar1 != 0) {
        uVar5 = 0;
        do {
          paVar2 = *(arena_t **)((long)apppuStack_40 + uVar5 * 8 + lVar3 + -0x38 + 0x40);
          if (paVar2 != (arena_t *)0x0) {
            *(undefined8 *)((long)apppuStack_40 + lVar3) = 0x1c3a915;
            duckdb_je_arena_decay(tsdn,paVar2,false,all);
          }
          uVar5 = uVar5 + 1;
        } while (uVar7 != uVar5);
      }
    }
  }
  else {
    paVar2 = (arena_t *)duckdb_je_arenas[arena_ind].repr;
    if (paVar2 != (arena_t *)0x0) {
      ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
      apppuStack_40[0] = (undefined1 ***)0x1c3a8c0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
      duckdb_je_arena_decay(tsdn,paVar2,false,all);
      return;
    }
    apppuStack_40[0] = (undefined1 ***)0x1c3a94a;
    arena_i_decay_cold_1();
  }
  return;
}

Assistant:

static void
arena_i_decay(tsdn_t *tsdn, unsigned arena_ind, bool all) {
	malloc_mutex_lock(tsdn, &ctl_mtx);
	{
		unsigned narenas = ctl_arenas->narenas;

		/*
		 * Access via index narenas is deprecated, and scheduled for
		 * removal in 6.0.0.
		 */
		if (arena_ind == MALLCTL_ARENAS_ALL || arena_ind == narenas) {
			unsigned i;
			VARIABLE_ARRAY_UNSAFE(arena_t *, tarenas, narenas);

			for (i = 0; i < narenas; i++) {
				tarenas[i] = arena_get(tsdn, i, false);
			}

			/*
			 * No further need to hold ctl_mtx, since narenas and
			 * tarenas contain everything needed below.
			 */
			malloc_mutex_unlock(tsdn, &ctl_mtx);

			for (i = 0; i < narenas; i++) {
				if (tarenas[i] != NULL) {
					arena_decay(tsdn, tarenas[i], false,
					    all);
				}
			}
		} else {
			arena_t *tarena;

			assert(arena_ind < narenas);

			tarena = arena_get(tsdn, arena_ind, false);

			/* No further need to hold ctl_mtx. */
			malloc_mutex_unlock(tsdn, &ctl_mtx);

			if (tarena != NULL) {
				arena_decay(tsdn, tarena, false, all);
			}
		}
	}
}